

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool scanImports(Options *options,QSet<QString> *usedDependencies)

{
  undefined8 *puVar1;
  size_t *psVar2;
  Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *pDVar3;
  pointer pQVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  PrivateShared *pPVar8;
  undefined8 uVar9;
  int *piVar10;
  bool bVar11;
  FILE *pFVar12;
  undefined1 auVar13 [8];
  Data *pDVar14;
  char16_t *pcVar15;
  char cVar16;
  byte bVar17;
  bool bVar18;
  char cVar19;
  int iVar20;
  iterator iVar21;
  iterator iVar22;
  char *pcVar23;
  size_t sVar24;
  char *pcVar25;
  iterator iVar26;
  iterator iVar27;
  long lVar28;
  QVariant *pQVar29;
  Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *pDVar30;
  QString *qrcFile;
  pointer pQVar31;
  QString *pQVar32;
  long lVar33;
  QChar QVar34;
  uint uVar35;
  QString *import;
  QString *prefix;
  long in_FS_OFFSET;
  QAnyStringView QVar36;
  QLatin1String QVar37;
  QAnyStringView QVar38;
  QLatin1String QVar39;
  QLatin1String QVar40;
  QStringView QVar41;
  QLatin1String QVar42;
  QLatin1String QVar43;
  QLatin1String QVar44;
  QLatin1String QVar45;
  QLatin1String QVar46;
  QLatin1String QVar47;
  QLatin1String QVar48;
  QLatin1String QVar49;
  QLatin1String QVar50;
  QFileInfo qmldirFileInfo;
  QFileInfo pluginFileInfo;
  QUrl url;
  QFileInfo info;
  QJsonObject object;
  QJsonArray jsonArray;
  QJsonDocument jsonDocument;
  UP qmlImportScannerCommand;
  QFileInfo fileInfo;
  char buffer [512];
  QJsonArray local_4f0 [8];
  QString local_4e8;
  undefined1 *local_4c8;
  QHash<QString,_QHashDummyValue> local_4c0;
  QString local_4b8;
  undefined1 *local_4a0;
  QArrayData *local_498;
  undefined1 *puStack_490;
  undefined1 *local_488;
  anon_class_24_3_0a0102aa local_478;
  undefined1 local_458 [8];
  QtDependency *pQStack_450;
  long local_448;
  QString local_438;
  undefined1 *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  undefined1 local_3f8 [16];
  QByteArray local_3e8;
  QStringBuilder<const_QString_&,_QLatin1String> local_3d0;
  QString local_3b8;
  QArrayDataPointer<QString> local_398;
  QString local_378;
  QString local_358;
  undefined1 local_340 [8];
  undefined1 *local_338;
  QArrayDataPointer<QVariant> local_320;
  undefined1 local_308 [8];
  Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *pDStack_300;
  Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *local_2f8;
  char *local_2f0;
  QDir *local_2e8;
  char16_t local_2e0;
  QString *local_2d8;
  qsizetype local_2d0;
  char *local_2c8;
  undefined1 local_2b8 [32];
  QArrayData *local_298;
  undefined1 *puStack_290;
  undefined1 *local_288;
  undefined1 local_278 [32];
  QStringBuilder<char16_t,_QString> local_258 [16];
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_340 = (undefined1  [8])usedDependencies;
  if (options->verbose == true) {
    fwrite("Scanning for QML imports.\n",0x1a,1,_stdout);
  }
  local_358.d.d = (Data *)0x0;
  local_358.d.ptr = (char16_t *)0x0;
  local_358.d.size = 0;
  if ((options->qmlImportScannerBinaryPath).d.size == 0) {
    local_258[0]._0_8_ = &options->qtLibExecsDirectory;
    local_258[0].b.d.d = (Data *)0x11;
    local_258[0].b.d.ptr = L"/qmlimportscanner";
    QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>
              (&local_378,(QStringBuilder<QString_&,_QLatin1String> *)(local_278 + 0x20));
    pDVar14 = local_358.d.d;
    local_358.d.size = local_378.d.size;
    local_358.d.ptr = local_378.d.ptr;
    local_358.d.d = local_378.d.d;
    local_378.d.size = 0;
    local_378.d.d = (Data *)0x0;
    local_378.d.ptr = (char16_t *)0x0;
    if (&pDVar14->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar14->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar14->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar14->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar14->super_QArrayData,2,0x10);
      }
    }
    if (&(local_378.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_378.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_378.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_378.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_378.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    QString::operator=(&local_358,&options->qmlImportScannerBinaryPath);
  }
  local_398.d = (Data *)0x0;
  local_398.ptr = (QString *)0x0;
  local_398.size = 0;
  local_3b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_3b8.d.d._0_4_ = 0xaaaaaaaa;
  local_3b8.d.d._4_4_ = 0xaaaaaaaa;
  local_3b8.d.ptr._0_4_ = 0xaaaaaaaa;
  local_3b8.d.ptr._4_4_ = 0xaaaaaaaa;
  local_258[0]._0_8_ = &options->qtInstallDirectory;
  local_258[0].b.d.ptr = (char16_t *)&options->qtQmlDirectory;
  local_258[0].b.d.d = (Data *)CONCAT62(local_258[0].b.d.d._2_6_,0x2f);
  QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QString_&>::convertTo<QString>
            (&local_3b8,
             (QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QString_&> *)(local_278 + 0x20));
  cVar16 = QFile::exists(&local_3b8);
  if (cVar16 != '\0') {
    shellQuote((QString *)(local_278 + 0x20),&local_3b8);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_398,local_398.size,(QString *)(local_278 + 0x20))
    ;
    QList<QString>::end((QList<QString> *)&local_398);
    if ((Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)local_258[0]._0_8_ !=
        (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_258[0]._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_258[0]._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_258[0]._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_258[0]._0_8_,2,0x10);
      }
    }
  }
  pDVar30 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)
            (options->extraPrefixDirs).super__Vector_base<QString,_std::allocator<QString>_>._M_impl
            .super__Vector_impl_data._M_start;
  pDVar3 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)
           (options->extraPrefixDirs).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pDVar30 != pDVar3) {
    pQVar32 = (QString *)(local_278 + 0x20);
    do {
      pDStack_300 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)&DAT_00000004;
      local_2f8 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)0x146df6;
      local_308 = (undefined1  [8])pDVar30;
      QStringBuilder<const_QString_&,_QLatin1String>::convertTo<QString>
                (pQVar32,(QStringBuilder<const_QString_&,_QLatin1String> *)local_308);
      cVar16 = QFile::exists(pQVar32);
      if ((Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)local_258[0]._0_8_ !=
          (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_258[0]._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_258[0]._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_258[0]._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate((QArrayData *)local_258[0]._0_8_,2,0x10);
        }
      }
      if (cVar16 != '\0') {
        local_3d0.b.m_size = 4;
        local_3d0.b.m_data = "/qml";
        local_3d0.a = (QString *)pDVar30;
        QStringBuilder<const_QString_&,_QLatin1String>::convertTo<QString>
                  ((QString *)local_308,&local_3d0);
        shellQuote(pQVar32,(QString *)local_308);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_398,local_398.size,pQVar32);
        QList<QString>::end((QList<QString> *)&local_398);
        if ((Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)local_258[0]._0_8_ !=
            (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_258[0]._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_258[0]._0_8_)->_q_value).super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_258[0]._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
             ) {
            QArrayData::deallocate((QArrayData *)local_258[0]._0_8_,2,0x10);
          }
        }
        if (local_308 != (undefined1  [8])0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_308,2,0x10);
          }
        }
      }
      pDVar30 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)&pDVar30->seed;
    } while (pDVar30 != pDVar3);
  }
  lVar33 = (options->qmlImportPaths).d.size;
  if (lVar33 != 0) {
    pQVar32 = (options->qmlImportPaths).d.ptr;
    lVar33 = lVar33 * 0x18;
    do {
      cVar16 = QFile::exists(pQVar32);
      if (cVar16 == '\0') {
        scanImports();
      }
      else {
        shellQuote((QString *)(local_278 + 0x20),pQVar32);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_398,local_398.size,
                   (QString *)(local_278 + 0x20));
        QList<QString>::end((QList<QString> *)&local_398);
        if ((Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)local_258[0]._0_8_ !=
            (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_258[0]._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_258[0]._0_8_)->_q_value).super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_258[0]._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
             ) {
            QArrayData::deallocate((QArrayData *)local_258[0]._0_8_,2,0x10);
          }
        }
      }
      pQVar32 = pQVar32 + 1;
      lVar33 = lVar33 + -0x18;
    } while (lVar33 != 0);
  }
  iVar21 = QList<QString>::begin((QList<QString> *)&local_398);
  iVar22 = QList<QString>::end((QList<QString> *)&local_398);
  if (iVar21.i == iVar22.i) {
LAB_0012001a:
    scanImports();
  }
  else {
    bVar18 = false;
    do {
      local_258[0]._0_8_ = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)0x0;
      local_258[0].b.d.d = (Data *)0x0;
      local_258[0].b.d.ptr = (char16_t *)0x0;
      QDir::QDir((QDir *)local_308,(QString *)(local_278 + 0x20));
      bVar17 = QDir::exists((QString *)local_308);
      QDir::~QDir((QDir *)local_308);
      if ((Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)local_258[0]._0_8_ !=
          (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_258[0]._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_258[0]._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_258[0]._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate((QArrayData *)local_258[0]._0_8_,2,0x10);
        }
      }
      if (bVar17 != 0) {
        bVar18 = true;
      }
      iVar21.i = iVar21.i + 1;
    } while ((iVar21.i == iVar22.i | bVar17) != 1);
    if (!bVar18) goto LAB_0012001a;
    cVar16 = QFile::exists(&local_358);
    if (cVar16 != '\0') {
      pQVar31 = (options->rootPaths).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
                super__Vector_impl_data._M_start;
      pQVar4 = (options->rootPaths).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pQVar31 != pQVar4) {
        do {
          local_308 = (undefined1  [8])(pQVar31->d).d;
          pDStack_300 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)(pQVar31->d).ptr
          ;
          local_2f8 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)(pQVar31->d).size;
          if (local_308 != (undefined1  [8])0x0) {
            LOCK();
            (((QArrayData *)
             &((Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)local_308)->ref)->ref_).
            _q_value.super___atomic_base<int>._M_i =
                 (((QArrayData *)
                  &((Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)local_308)->ref)->
                 ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QFileInfo::QFileInfo((QFileInfo *)&local_3e8,(QString *)local_308);
          QFileInfo::absoluteFilePath();
          pcVar15 = local_258[0].b.d.ptr;
          uVar9 = local_258[0]._0_8_;
          pDVar30 = pDStack_300;
          auVar13 = local_308;
          local_258[0]._0_8_ = local_308;
          local_308 = (undefined1  [8])uVar9;
          pDStack_300 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)
                        local_258[0].b.d.d;
          local_258[0].b.d.d = (Data *)pDVar30;
          local_258[0].b.d.ptr = (char16_t *)local_2f8;
          local_2f8 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)pcVar15;
          if (auVar13 != (undefined1  [8])0x0) {
            LOCK();
            (((QBasicAtomicInt *)auVar13)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)auVar13)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)auVar13)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)auVar13,2,0x10);
            }
          }
          QFileInfo::~QFileInfo((QFileInfo *)&local_3e8);
          QVar34.ucs = (char16_t)(QString *)local_308;
          cVar16 = QString::endsWith(QVar34,0x2f);
          if (cVar16 == '\0') {
            QString::append(QVar34);
          }
          if (local_2f8 != (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)0x0) {
            shellQuote((QString *)(local_278 + 0x20),(QString *)local_308);
            QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                      ((QMovableArrayOps<QString> *)&local_398,local_398.size,
                       (QString *)(local_278 + 0x20));
            QList<QString>::end((QList<QString> *)&local_398);
            if ((Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)local_258[0]._0_8_ !=
                (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_258[0]._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_258[0]._0_8_)->_q_value).super___atomic_base<int>._M_i
                   + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_258[0]._0_8_)->_q_value).super___atomic_base<int>._M_i
                  == 0) {
                QArrayData::deallocate((QArrayData *)local_258[0]._0_8_,2,0x10);
              }
            }
          }
          shellQuote(&local_58,(QString *)local_308);
          local_258[0].b.d.ptr = (char16_t *)(local_58.d.size | 0x8000000000000000);
          local_258[0].a._0_1_ = 1;
          local_258[0].b.d.d = (Data *)local_58.d.ptr;
          local_278._0_8_ = local_278 + 0x20;
          local_278._8_8_ = (char16_t *)0x0;
          QVar36.m_size = (size_t)" -rootPath %1";
          QVar36.field_0.m_data_utf8 = (char *)&local_3e8;
          QtPrivate::argToQString(QVar36,0x400000000000000d,(ArgBase **)0x1);
          QString::append(&local_358);
          if ((QJsonParseError)local_3e8.d.d != (QJsonParseError)0x0) {
            LOCK();
            *(int *)local_3e8.d.d = *(int *)local_3e8.d.d + -1;
            UNLOCK();
            if (*(int *)local_3e8.d.d == 0) {
              QArrayData::deallocate(&(local_3e8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (local_308 != (undefined1  [8])0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_308,2,0x10);
            }
          }
          pQVar31 = pQVar31 + 1;
        } while (pQVar31 != pQVar4);
      }
      if ((options->qrcFiles).d.size != 0) {
        QVar37.m_data = (char *)0xa;
        QVar37.m_size = (qsizetype)&local_358;
        QString::append(QVar37);
        iVar21 = QList<QString>::begin(&options->qrcFiles);
        iVar22 = QList<QString>::end(&options->qrcFiles);
        if (iVar21.i != iVar22.i) {
          do {
            shellQuote((QString *)local_308,iVar21.i);
            local_258[0].b.d.size = (qsizetype)local_2f8;
            local_258[0].b.d.ptr = (char16_t *)pDStack_300;
            local_258[0].b.d.d = (Data *)local_308;
            local_258[0].a = 0x20;
            local_308 = (undefined1  [8])0x0;
            pDStack_300 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)0x0;
            local_2f8 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)0x0;
            operator+=(&local_358,(QStringBuilder<char16_t,_QString> *)(local_278 + 0x20));
            if ((Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)local_258[0].b.d.d !=
                (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)0x0) {
              LOCK();
              ((local_258[0].b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_258[0].b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if (((local_258[0].b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                  _M_i == 0) {
                QArrayData::deallocate(&(local_258[0].b.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (local_308 != (undefined1  [8])0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate((QArrayData *)local_308,2,0x10);
              }
            }
            iVar21.i = iVar21.i + 1;
          } while (iVar21.i != iVar22.i);
        }
      }
      local_258[0].a = 0x20;
      QtPrivate::QStringList_join
                ((QList *)&local_3e8,(QChar *)&local_398,(longlong)(local_278 + 0x20));
      local_258[0].b.d.ptr = (char16_t *)(local_3e8.d.size | 0x8000000000000000);
      local_258[0].a._0_1_ = 1;
      local_258[0].b.d.d = (Data *)local_3e8.d.ptr;
      local_58.d.ptr = (char16_t *)0x0;
      QVar38.m_size = (size_t)" -importPath %1";
      QVar38.field_0.m_data = local_308;
      local_58.d.d = (Data *)(local_278 + 0x20);
      QtPrivate::argToQString(QVar38,0x400000000000000f,(ArgBase **)0x1);
      QString::append(&local_358);
      if (local_308 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_308,2,0x10);
        }
      }
      if ((QJsonParseError)local_3e8.d.d != (QJsonParseError)0x0) {
        LOCK();
        *(int *)local_3e8.d.d = *(int *)local_3e8.d.d + -1;
        UNLOCK();
        if (*(int *)local_3e8.d.d == 0) {
          QArrayData::deallocate(&(local_3e8.d.d)->super_QArrayData,2,0x10);
        }
      }
      pFVar12 = _stdout;
      if (options->verbose == true) {
        QString::toLocal8Bit_helper((QChar *)(local_278 + 0x20),(longlong)local_358.d.ptr);
        pDVar30 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)local_258[0].b.d.d;
        if ((Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)local_258[0].b.d.d ==
            (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)0x0) {
          pDVar30 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)&QByteArray::_empty;
        }
        fprintf(pFVar12,"Running qmlimportscanner with the following command: %s\n",pDVar30);
        if ((Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)local_258[0]._0_8_ !=
            (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_258[0]._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_258[0]._0_8_)->_q_value).super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_258[0]._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
             ) {
            QArrayData::deallocate((QArrayData *)local_258[0]._0_8_,1,0x10);
          }
        }
      }
      local_3f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      openProcess((QString *)(local_3f8 + 8));
      if ((FILE *)local_3f8._8_8_ == (FILE *)0x0) {
        scanImports();
        bVar18 = false;
      }
      else {
        local_3e8.d.d = (Data *)0x0;
        local_3e8.d.ptr = (char *)0x0;
        local_3e8.d.size = 0;
        memset(local_278 + 0x20,0xaa,0x200);
        pcVar23 = fgets(local_278 + 0x20,0x200,(FILE *)local_3f8._8_8_);
        if (pcVar23 != (char *)0x0) {
          pcVar23 = local_278 + 0x20;
          do {
            sVar24 = strlen(pcVar23);
            QByteArray::QByteArray((QByteArray *)local_308,pcVar23,sVar24);
            QByteArray::append(&local_3e8);
            if (local_308 != (undefined1  [8])0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate((QArrayData *)local_308,1,0x10);
              }
            }
            pcVar25 = fgets(pcVar23,0x200,(FILE *)local_3f8._8_8_);
          } while (pcVar25 != (char *)0x0);
        }
        local_3f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QJsonDocument::fromJson((QByteArray *)local_3f8,(QJsonParseError *)&local_3e8);
        cVar16 = QJsonDocument::isNull();
        if (cVar16 == '\0') {
          local_400 = &DAT_aaaaaaaaaaaaaaaa;
          QJsonDocument::array();
          lVar33 = QJsonArray::size();
          if (lVar33 < 1) {
            bVar18 = true;
          }
          else {
            lVar33 = 0;
            do {
              local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              QJsonArray::at((longlong)&local_58);
              iVar20 = QJsonValue::type();
              if (iVar20 == 5) {
                local_408 = &DAT_aaaaaaaaaaaaaaaa;
                QJsonValue::toObject();
                local_278._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_278._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_278._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                QVar39.m_data = (char *)&local_408;
                QVar39.m_size = (qsizetype)local_308;
                QJsonObject::value(QVar39);
                QJsonValue::toString();
                QJsonValue::~QJsonValue((QJsonValue *)local_308);
                pFVar12 = _stderr;
                if ((undefined1 *)local_278._16_8_ == (undefined1 *)0x0) {
                  QVar43.m_data = (char *)&local_408;
                  QVar43.m_size = (qsizetype)local_2b8;
                  QJsonObject::value(QVar43);
                  QJsonValue::toString();
                  QString::toLocal8Bit_helper((QChar *)local_308,(longlong)puStack_290);
                  pDVar30 = pDStack_300;
                  if (pDStack_300 == (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)0x0
                     ) {
                    pDVar30 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)
                              &QByteArray::_empty;
                  }
                  fprintf(pFVar12,
                          "Warning: QML import could not be resolved in any of the import paths: %s\n"
                          ,pDVar30);
                  if (local_308 != (undefined1  [8])0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i +
                         -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i ==
                        0) {
                      QArrayData::deallocate((QArrayData *)local_308,1,0x10);
                    }
                  }
                  if (local_298 != (QArrayData *)0x0) {
                    LOCK();
                    (local_298->ref_)._q_value.super___atomic_base<int>._M_i =
                         (local_298->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((local_298->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(local_298,2,0x10);
                    }
                  }
                  QJsonValue::~QJsonValue((QJsonValue *)local_2b8);
LAB_0011fd47:
                  uVar35 = 0;
                }
                else {
                  QVar40.m_data = (char *)&local_408;
                  QVar40.m_size = (qsizetype)&local_298;
                  QJsonObject::value(QVar40);
                  QJsonValue::toString();
                  if (local_2f8 == (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)0x6)
                  {
                    QVar41.m_data = (storage_type *)pDStack_300;
                    QVar41.m_size = 6;
                    QVar50.m_data = "module";
                    QVar50.m_size = 6;
                    cVar16 = QtPrivate::equalStrings(QVar41,QVar50);
                  }
                  else {
                    cVar16 = '\0';
                  }
                  if (local_308 != (undefined1  [8])0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i +
                         -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i ==
                        0) {
                      QArrayData::deallocate((QArrayData *)local_308,2,0x10);
                    }
                  }
                  QJsonValue::~QJsonValue((QJsonValue *)&local_298);
                  pFVar12 = _stdout;
                  if (cVar16 == '\0') goto LAB_0011fd47;
                  if (options->verbose == true) {
                    QString::toLocal8Bit_helper((QChar *)local_308,local_278._8_8_);
                    pDVar30 = pDStack_300;
                    if (pDStack_300 ==
                        (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)0x0) {
                      pDVar30 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)
                                &QByteArray::_empty;
                    }
                    fprintf(pFVar12,"  -- Adding \'%s\' as QML dependency\n",pDVar30);
                    if (local_308 != (undefined1  [8])0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i =
                           (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i
                           + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i
                          == 0) {
                        QArrayData::deallocate((QArrayData *)local_308,1,0x10);
                      }
                    }
                  }
                  local_410 = &DAT_aaaaaaaaaaaaaaaa;
                  QFileInfo::QFileInfo((QFileInfo *)&local_410,(QString *)local_278);
                  cVar16 = QFileInfo::exists();
                  if (cVar16 == '\0') {
                    uVar35 = 0x10;
                    if (options->verbose == true) {
                      fwrite("    -- Skipping because path does not exist.\n",0x2d,1,_stdout);
                    }
                  }
                  else {
                    local_288 = &DAT_aaaaaaaaaaaaaaaa;
                    local_298 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
                    puStack_290 = &DAT_aaaaaaaaaaaaaaaa;
                    QFileInfo::absolutePath();
                    cVar16 = QString::endsWith((QChar)(char16_t)&local_298,0x2f);
                    if (cVar16 == '\0') {
                      QString::append((QChar)(char16_t)&local_298);
                    }
                    local_418 = &DAT_aaaaaaaaaaaaaaaa;
                    QVar42.m_data = (char *)&local_408;
                    QVar42.m_size = (qsizetype)local_2b8;
                    QJsonObject::value(QVar42);
                    QJsonValue::toString();
                    QUrl::QUrl((QUrl *)&local_418,
                               (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QLatin1String>,_QString_&>,_char16_t>,_QString_&>,_QLatin1String>
                                *)local_308,0);
                    if (local_308 != (undefined1  [8])0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i =
                           (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i
                           + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i
                          == 0) {
                        QArrayData::deallocate((QArrayData *)local_308,2,0x10);
                      }
                    }
                    QJsonValue::~QJsonValue((QJsonValue *)local_2b8);
                    local_2b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_2b8._0_4_ = 0xaaaaaaaa;
                    local_2b8._4_4_ = 0xaaaaaaaa;
                    local_2b8._8_4_ = 0xaaaaaaaa;
                    local_2b8._12_4_ = 0xaaaaaaaa;
                    QUrl::toString(&local_438,&local_418,0);
                    local_2f0 = (char *)QString::replace((QChar)(char16_t)&local_438,(QChar)0x2e,
                                                         0x2f);
                    local_308 = (undefined1  [8])0x0;
                    pDStack_300 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)
                                  0x148c2c;
                    local_2f8 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)0x1;
                    QStringBuilder<QString,_QString_&>::convertTo<QString>
                              ((QString *)local_2b8,(QStringBuilder<QString,_QString_&> *)local_308)
                    ;
                    if (local_308 != (undefined1  [8])0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i =
                           (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i
                           + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i
                          == 0) {
                        QArrayData::deallocate((QArrayData *)local_308,2,0x10);
                      }
                    }
                    if (&(local_438.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_438.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_438.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_438.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_438.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    QFileInfo::absolutePath();
                    bVar18 = checkCanImportFromRootPaths
                                       (options,(QString *)local_308,(QString *)local_2b8);
                    if (local_308 != (undefined1  [8])0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i =
                           (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i
                           + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i
                          == 0) {
                        QArrayData::deallocate((QArrayData *)local_308,2,0x10);
                      }
                    }
                    if (bVar18) {
                      uVar35 = 0x10;
                      if (options->verbose == true) {
                        fwrite("    -- Skipping because path is in QML root path.\n",0x32,1,_stdout)
                        ;
                      }
                    }
                    else {
                      local_438.d.d = (Data *)0x0;
                      local_438.d.ptr = (char16_t *)0x0;
                      local_438.d.size = 0;
                      if (local_398.size != 0) {
                        lVar28 = local_398.size * 0x18;
                        pQVar32 = local_398.ptr;
                        do {
                          local_2f8 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)
                                      &DAT_aaaaaaaaaaaaaaaa;
                          local_308 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
                          pDStack_300 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)
                                        &DAT_aaaaaaaaaaaaaaaa;
                          QDir::cleanPath((QString *)local_308);
                          local_478.qmlImportsDependencies = (QList<QtDependency> *)local_2b8;
                          local_478.usedDependencies = (QSet<QString> **)local_308;
                          QStringBuilder<QString_&,_const_QString_&>::convertTo<QString>
                                    ((QString *)local_458,
                                     (QStringBuilder<QString_&,_const_QString_&> *)&local_478);
                          cVar16 = QFile::exists((QString *)local_458);
                          if (local_458 != (undefined1  [8])0x0) {
                            LOCK();
                            (((QBasicAtomicInt *)local_458)->_q_value).super___atomic_base<int>._M_i
                                 = (((QBasicAtomicInt *)local_458)->_q_value).
                                   super___atomic_base<int>._M_i + -1;
                            UNLOCK();
                            if ((((QBasicAtomicInt *)local_458)->_q_value).super___atomic_base<int>.
                                _M_i == 0) {
                              QArrayData::deallocate((QArrayData *)local_458,2,0x10);
                            }
                          }
                          if (cVar16 != '\0') {
                            QString::operator=(&local_438,pQVar32);
                            if (local_308 != (undefined1  [8])0x0) {
                              LOCK();
                              (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>.
                              _M_i = (((QBasicAtomicInt *)local_308)->_q_value).
                                     super___atomic_base<int>._M_i + -1;
                              UNLOCK();
                              if ((((QBasicAtomicInt *)local_308)->_q_value).
                                  super___atomic_base<int>._M_i == 0) {
                                QArrayData::deallocate((QArrayData *)local_308,2,0x10);
                              }
                            }
                            break;
                          }
                          if (local_308 != (undefined1  [8])0x0) {
                            LOCK();
                            (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i
                                 = (((QBasicAtomicInt *)local_308)->_q_value).
                                   super___atomic_base<int>._M_i + -1;
                            UNLOCK();
                            if ((((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>.
                                _M_i == 0) {
                              QArrayData::deallocate((QArrayData *)local_308,2,0x10);
                            }
                          }
                          pQVar32 = pQVar32 + 1;
                          lVar28 = lVar28 + -0x18;
                        } while (lVar28 != 0);
                      }
                      pFVar12 = _stderr;
                      if (local_438.d.size == 0) {
                        QFileInfo::absoluteFilePath();
                        QString::toLocal8Bit_helper((QChar *)local_308,(longlong)pQStack_450);
                        pDVar30 = pDStack_300;
                        if (pDStack_300 ==
                            (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)0x0) {
                          pDVar30 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)
                                    &QByteArray::_empty;
                        }
                        fprintf(pFVar12,"Import found outside of import paths: %s.\n",pDVar30);
                        if (local_308 != (undefined1  [8])0x0) {
                          LOCK();
                          (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>._M_i =
                               (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>.
                               _M_i + -1;
                          UNLOCK();
                          if ((((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>.
                              _M_i == 0) {
                            QArrayData::deallocate((QArrayData *)local_308,1,0x10);
                          }
                        }
                        if (local_458 != (undefined1  [8])0x0) {
                          LOCK();
                          (((QBasicAtomicInt *)local_458)->_q_value).super___atomic_base<int>._M_i =
                               (((QBasicAtomicInt *)local_458)->_q_value).super___atomic_base<int>.
                               _M_i + -1;
                          UNLOCK();
                          if ((((QBasicAtomicInt *)local_458)->_q_value).super___atomic_base<int>.
                              _M_i == 0) {
                            QArrayData::deallocate((QArrayData *)local_458,2,0x10);
                          }
                        }
                        uVar35 = 1;
                      }
                      else {
                        QDir::QDir((QDir *)&local_498,&local_438);
                        QDir::absolutePath();
                        local_2f8 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)
                                    local_478.importPathOfThisImport;
                        pDStack_300 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)
                                      local_478.qmlImportsDependencies;
                        local_308 = (undefined1  [8])local_478.usedDependencies;
                        local_478.usedDependencies = (QSet<QString> **)0x0;
                        local_478.qmlImportsDependencies = (QList<QtDependency> *)0x0;
                        local_478.importPathOfThisImport = (QString *)0x0;
                        local_2f0 = (char *)CONCAT62(local_2f0._2_6_,0x2f);
                        QStringBuilder<QString,_char16_t>::convertTo<QString>
                                  ((QString *)local_458,
                                   (QStringBuilder<QString,_char16_t> *)local_308);
                        pcVar15 = local_438.d.ptr;
                        pDVar14 = local_438.d.d;
                        lVar28 = local_448;
                        auVar13 = local_458;
                        local_458 = (undefined1  [8])local_438.d.d;
                        local_438.d.d = (Data *)auVar13;
                        local_438.d.ptr = (char16_t *)pQStack_450;
                        pQStack_450 = (QtDependency *)pcVar15;
                        local_448 = local_438.d.size;
                        local_438.d.size = lVar28;
                        if (&pDVar14->super_QArrayData != (QArrayData *)0x0) {
                          LOCK();
                          (pDVar14->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                               (pDVar14->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                               _M_i + -1;
                          UNLOCK();
                          if ((pDVar14->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                              _M_i == 0) {
                            QArrayData::deallocate(&pDVar14->super_QArrayData,2,0x10);
                          }
                        }
                        auVar13 = local_308;
                        if (local_308 != (undefined1  [8])0x0) {
                          LOCK();
                          *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QLatin1String>,_QString_&>,_char16_t>,_QString_&>
                                      *)local_308)->a).a.a.a.a =
                               *(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QLatin1String>,_QString_&>,_char16_t>,_QString_&>
                                           *)local_308)->a).a.a.a.a + -1;
                          UNLOCK();
                          if (*(int *)&(((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QLatin1String>,_QString_&>,_char16_t>,_QString_&>
                                          *)auVar13)->a).a.a.a.a == 0) {
                            QArrayData::deallocate((QArrayData *)local_308,2,0x10);
                          }
                        }
                        if ((QArrayData *)local_478.usedDependencies != (QArrayData *)0x0) {
                          LOCK();
                          (((QBasicAtomicInt *)local_478.usedDependencies)->_q_value).
                          super___atomic_base<int>._M_i =
                               (((QBasicAtomicInt *)local_478.usedDependencies)->_q_value).
                               super___atomic_base<int>._M_i + -1;
                          UNLOCK();
                          if ((((QBasicAtomicInt *)local_478.usedDependencies)->_q_value).
                              super___atomic_base<int>._M_i == 0) {
                            QArrayData::deallocate((QArrayData *)local_478.usedDependencies,2,0x10);
                          }
                        }
                        QDir::~QDir((QDir *)&local_498);
                        local_458 = (undefined1  [8])0x0;
                        pQStack_450 = (QtDependency *)0x0;
                        local_448 = 0;
                        local_478.usedDependencies = (QSet<QString> **)local_340;
                        local_478.qmlImportsDependencies = (QList<QtDependency> *)local_458;
                        local_478.importPathOfThisImport = &local_438;
                        local_488 = &DAT_aaaaaaaaaaaaaaaa;
                        local_498 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
                        puStack_490 = &DAT_aaaaaaaaaaaaaaaa;
                        QVar44.m_data = (char *)&local_408;
                        QVar44.m_size = (qsizetype)local_308;
                        QJsonObject::value(QVar44);
                        QJsonValue::toString();
                        QJsonValue::~QJsonValue((QJsonValue *)local_308);
                        QVar45.m_data = (char *)&local_408;
                        QVar45.m_size = (qsizetype)local_308;
                        QJsonObject::value(QVar45);
                        cVar16 = QJsonValue::toBool(SUB81((
                                                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QLatin1String>,_QString_&>,_char16_t>,_QString_&>,_QLatin1String>
                                                  *)local_308,0));
                        QJsonValue::~QJsonValue((QJsonValue *)local_308);
                        local_4a0 = &DAT_aaaaaaaaaaaaaaaa;
                        local_308 = (undefined1  [8])local_278;
                        pDStack_300 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)
                                      CONCAT62(pDStack_300._2_6_,0x2f);
                        local_2f8 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)0x3;
                        local_2f0 = "lib";
                        local_2e0 = L'_';
                        local_2d0 = 3;
                        local_2c8 = ".so";
                        local_2e8 = (QDir *)&local_498;
                        local_2d8 = &options->currentArchitecture;
                        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QLatin1String>,_QString_&>,_char16_t>,_QString_&>,_QLatin1String>
                        ::convertTo<QString>
                                  (&local_4b8,
                                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QLatin1String>,_QString_&>,_char16_t>,_QString_&>,_QLatin1String>
                                    *)local_308);
                        QFileInfo::QFileInfo((QFileInfo *)&local_4a0,&local_4b8);
                        if (&(local_4b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                          LOCK();
                          ((local_4b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i = ((local_4b8.d.d)->super_QArrayData).ref_._q_value.
                                  super___atomic_base<int>._M_i + -1;
                          UNLOCK();
                          if (((local_4b8.d.d)->super_QArrayData).ref_._q_value.
                              super___atomic_base<int>._M_i == 0) {
                            QArrayData::deallocate(&(local_4b8.d.d)->super_QArrayData,2,0x10);
                          }
                        }
                        local_4b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                        local_4b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                        local_4b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                        QFileInfo::absoluteFilePath();
                        local_4c0.d = (Data *)0x0;
                        cVar19 = QFileInfo::exists();
                        if (((cVar19 == '\0') ||
                            (bVar18 = checkArchitecture(options,&local_4b8), !bVar18)) ||
                           (bVar18 = readDependenciesFromElf
                                               (options,&local_4b8,(QSet<QString> *)local_340,
                                                (QSet<QString> *)&local_4c0), !bVar18)) {
                          if (cVar16 != '\0') goto LAB_0011f7a5;
                          uVar35 = 0x10;
                          if (options->verbose == true) {
                            fwrite("    -- Skipping because the required plugin is missing.\n",0x38,
                                   1,_stdout);
                          }
                        }
                        else {
                          scanImports::anon_class_24_3_0a0102aa::operator()(&local_478,&local_4b8);
LAB_0011f7a5:
                          local_4c8 = &DAT_aaaaaaaaaaaaaaaa;
                          local_308 = (undefined1  [8])local_278;
                          pDStack_300 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)
                                        CONCAT62(pDStack_300._2_6_,0x2f);
                          local_2f8 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)
                                      0x6;
                          local_2f0 = "qmldir";
                          QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QLatin1String>::
                          convertTo<QString>(&local_4e8,
                                             (QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QLatin1String>
                                              *)local_308);
                          QFileInfo::QFileInfo((QFileInfo *)&local_4c8,&local_4e8);
                          if (&(local_4e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                            LOCK();
                            ((local_4e8.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i =
                                 ((local_4e8.d.d)->super_QArrayData).ref_._q_value.
                                 super___atomic_base<int>._M_i + -1;
                            UNLOCK();
                            if (((local_4e8.d.d)->super_QArrayData).ref_._q_value.
                                super___atomic_base<int>._M_i == 0) {
                              QArrayData::deallocate(&(local_4e8.d.d)->super_QArrayData,2,0x10);
                            }
                          }
                          cVar16 = QFileInfo::exists();
                          if (cVar16 != '\0') {
                            QFileInfo::absoluteFilePath();
                            scanImports::anon_class_24_3_0a0102aa::operator()
                                      (&local_478,(QString *)local_308);
                            if (local_308 != (undefined1  [8])0x0) {
                              LOCK();
                              (((QBasicAtomicInt *)local_308)->_q_value).super___atomic_base<int>.
                              _M_i = (((QBasicAtomicInt *)local_308)->_q_value).
                                     super___atomic_base<int>._M_i + -1;
                              UNLOCK();
                              if ((((QBasicAtomicInt *)local_308)->_q_value).
                                  super___atomic_base<int>._M_i == 0) {
                                QArrayData::deallocate((QArrayData *)local_308,2,0x10);
                              }
                            }
                          }
                          local_4e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                          local_4e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                          local_4e8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                          QVar46.m_data = (char *)&local_408;
                          QVar46.m_size = (qsizetype)local_308;
                          QJsonObject::value(QVar46);
                          QJsonValue::toString();
                          QJsonValue::~QJsonValue((QJsonValue *)local_308);
                          QVar47.m_data = (char *)0x2;
                          QVar47.m_size = (qsizetype)&local_4e8;
                          cVar16 = QString::startsWith(QVar47,0x1470f8);
                          if (cVar16 == '\0') {
                            local_2f8 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_> *)
                                        &DAT_aaaaaaaaaaaaaaaa;
                            local_308 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
                            pDStack_300 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_>
                                           *)&DAT_aaaaaaaaaaaaaaaa;
                            QVar48.m_data = (char *)&local_408;
                            QVar48.m_size = (qsizetype)&local_320;
                            QJsonObject::value(QVar48);
                            QJsonValue::toArray();
                            QJsonArray::toVariantList();
                            QJsonArray::~QJsonArray((QJsonArray *)&local_338);
                            QJsonValue::~QJsonValue((QJsonValue *)&local_320);
                            QVar49.m_data = (char *)&local_408;
                            QVar49.m_size = (qsizetype)&local_338;
                            QJsonObject::value(QVar49);
                            QJsonValue::toArray();
                            QJsonArray::toVariantList();
                            if ((QString *)local_320.size != (QString *)0x0) {
                              if ((&(local_320.d)->super_QArrayData == (QArrayData *)0x0) ||
                                 (1 < ((local_320.d)->super_QArrayData).ref_._q_value.
                                      super___atomic_base<int>._M_i)) {
                                QtPrivate::QCommonArrayOps<QVariant>::growAppend
                                          ((QCommonArrayOps<QVariant> *)local_308,local_320.ptr,
                                           local_320.ptr + local_320.size);
                              }
                              else {
                                QArrayDataPointer<QVariant>::detachAndGrow
                                          ((QArrayDataPointer<QVariant> *)local_308,GrowsAtEnd,
                                           local_320.size,(QVariant **)0x0,
                                           (QArrayDataPointer<QVariant> *)0x0);
                                if (((QString *)local_320.size != (QString *)0x0) &&
                                   (pQVar29 = local_320.ptr, 0 < local_320.size)) {
                                  do {
                                    pPVar8 = (pQVar29->d).data.shared;
                                    uVar9 = *(undefined8 *)((long)&(pQVar29->d).data + 8);
                                    uVar5 = *(undefined4 *)((long)&(pQVar29->d).data + 0x14);
                                    uVar6 = *(undefined4 *)&(pQVar29->d).field_0x18;
                                    uVar7 = *(undefined4 *)&(pQVar29->d).field_0x1c;
                                    psVar2 = &pDStack_300->numBuckets + (long)local_2f8 * 4;
                                    *(undefined4 *)psVar2 =
                                         *(undefined4 *)((long)&(pQVar29->d).data + 0x10);
                                    *(undefined4 *)((long)psVar2 + 4) = uVar5;
                                    *(undefined4 *)(psVar2 + 1) = uVar6;
                                    *(undefined4 *)((long)psVar2 + 0xc) = uVar7;
                                    puVar1 = (undefined8 *)
                                             ((long)&pDStack_300->ref + (long)local_2f8 * 0x20);
                                    *puVar1 = pPVar8;
                                    puVar1[1] = uVar9;
                                    (pQVar29->d).data.shared = (PrivateShared *)0x0;
                                    *(undefined8 *)((long)&(pQVar29->d).data + 8) = 0;
                                    *(undefined8 *)((long)&(pQVar29->d).data + 0x10) = 0;
                                    *(undefined8 *)&(pQVar29->d).field_0x18 = 2;
                                    pQVar29 = pQVar29 + 1;
                                    local_2f8 = (Data<QHashPrivate::Node<QString,_QList<QtDependency>_>_>
                                                 *)((long)&((DataPointer *)&local_2f8->ref)->d + 1);
                                  } while (pQVar29 < local_320.ptr + local_320.size);
                                }
                              }
                            }
                            QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_320);
                            QJsonArray::~QJsonArray(local_4f0);
                            QJsonValue::~QJsonValue((QJsonValue *)&local_338);
                            iVar26 = QList<QVariant>::begin((QList<QVariant> *)local_308);
                            iVar27 = QList<QVariant>::end((QList<QVariant> *)local_308);
                            uVar35 = 0;
                            if (iVar26.i == iVar27.i) {
                              bVar18 = false;
                            }
                            else {
                              bVar11 = false;
                              do {
                                local_338 = &DAT_aaaaaaaaaaaaaaaa;
                                QVariant::toString();
                                QFileInfo::QFileInfo((QFileInfo *)&local_338,(QString *)&local_320);
                                if (&(local_320.d)->super_QArrayData != (QArrayData *)0x0) {
                                  LOCK();
                                  ((local_320.d)->super_QArrayData).ref_._q_value.
                                  super___atomic_base<int>._M_i =
                                       ((local_320.d)->super_QArrayData).ref_._q_value.
                                       super___atomic_base<int>._M_i + -1;
                                  UNLOCK();
                                  if (((local_320.d)->super_QArrayData).ref_._q_value.
                                      super___atomic_base<int>._M_i == 0) {
                                    QArrayData::deallocate(&(local_320.d)->super_QArrayData,2,0x10);
                                  }
                                }
                                bVar17 = QFileInfo::exists();
                                bVar18 = true;
                                if (bVar17 != 0) {
                                  QFileInfo::absoluteFilePath();
                                  scanImports::anon_class_24_3_0a0102aa::operator()
                                            (&local_478,(QString *)&local_320);
                                  bVar18 = bVar11;
                                  if (&(local_320.d)->super_QArrayData != (QArrayData *)0x0) {
                                    LOCK();
                                    ((local_320.d)->super_QArrayData).ref_._q_value.
                                    super___atomic_base<int>._M_i =
                                         ((local_320.d)->super_QArrayData).ref_._q_value.
                                         super___atomic_base<int>._M_i + -1;
                                    UNLOCK();
                                    if (((local_320.d)->super_QArrayData).ref_._q_value.
                                        super___atomic_base<int>._M_i == 0) {
                                      QArrayData::deallocate
                                                (&(local_320.d)->super_QArrayData,2,0x10);
                                    }
                                  }
                                }
                                QFileInfo::~QFileInfo((QFileInfo *)&local_338);
                                iVar26.i = iVar26.i + 1;
                                bVar11 = bVar18;
                              } while ((bVar17 & iVar26.i != iVar27.i) != 0);
                            }
                            if ((bVar18) && (uVar35 = 0x10, options->verbose == true)) {
                              fwrite("    -- Skipping because the required qml files are missing.\n"
                                     ,0x3c,1,_stdout);
                            }
                            QArrayDataPointer<QVariant>::~QArrayDataPointer
                                      ((QArrayDataPointer<QVariant> *)local_308);
                            if (!bVar18) goto LAB_0011fb99;
                          }
                          else {
LAB_0011fb99:
                            QHash<QString,QList<QtDependency>>::tryEmplace_impl<QString_const&>
                                      ((TryEmplaceResult *)local_308,&options->qtDependencies,
                                       &options->currentArchitecture);
                            QtPrivate::QCommonArrayOps<QtDependency>::growAppend
                                      ((QCommonArrayOps<QtDependency> *)
                                       ((((*(Span **)((long)local_308 + 0x20))
                                          [(ulong)pDStack_300 >> 7].entries)->storage).data +
                                       (ulong)((uint)(*(Span **)((long)local_308 + 0x20))
                                                     [(ulong)pDStack_300 >> 7].offsets
                                                     [(uint)pDStack_300 & 0x7f] * 0x30) + 0x18),
                                       pQStack_450,pQStack_450 + local_448);
                            uVar35 = 0;
                          }
                          if (&(local_4e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                            LOCK();
                            ((local_4e8.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i =
                                 ((local_4e8.d.d)->super_QArrayData).ref_._q_value.
                                 super___atomic_base<int>._M_i + -1;
                            UNLOCK();
                            if (((local_4e8.d.d)->super_QArrayData).ref_._q_value.
                                super___atomic_base<int>._M_i == 0) {
                              QArrayData::deallocate(&(local_4e8.d.d)->super_QArrayData,2,0x10);
                            }
                          }
                          QFileInfo::~QFileInfo((QFileInfo *)&local_4c8);
                        }
                        QHash<QString,_QHashDummyValue>::~QHash(&local_4c0);
                        if (&(local_4b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                          LOCK();
                          ((local_4b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i = ((local_4b8.d.d)->super_QArrayData).ref_._q_value.
                                  super___atomic_base<int>._M_i + -1;
                          UNLOCK();
                          if (((local_4b8.d.d)->super_QArrayData).ref_._q_value.
                              super___atomic_base<int>._M_i == 0) {
                            QArrayData::deallocate(&(local_4b8.d.d)->super_QArrayData,2,0x10);
                          }
                        }
                        QFileInfo::~QFileInfo((QFileInfo *)&local_4a0);
                        if (local_498 != (QArrayData *)0x0) {
                          LOCK();
                          (local_498->ref_)._q_value.super___atomic_base<int>._M_i =
                               (local_498->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                          UNLOCK();
                          if ((local_498->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                            QArrayData::deallocate(local_498,2,0x10);
                          }
                        }
                        QArrayDataPointer<QtDependency>::~QArrayDataPointer
                                  ((QArrayDataPointer<QtDependency> *)local_458);
                      }
                      if (&(local_438.d.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_438.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_438.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_438.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(&(local_438.d.d)->super_QArrayData,2,0x10);
                        }
                      }
                    }
                    piVar10 = (int *)CONCAT44(local_2b8._4_4_,local_2b8._0_4_);
                    if (piVar10 != (int *)0x0) {
                      LOCK();
                      *piVar10 = *piVar10 + -1;
                      UNLOCK();
                      if (*piVar10 == 0) {
                        QArrayData::deallocate
                                  ((QArrayData *)CONCAT44(local_2b8._4_4_,local_2b8._0_4_),2,0x10);
                      }
                    }
                    QUrl::~QUrl((QUrl *)&local_418);
                    if (local_298 != (QArrayData *)0x0) {
                      LOCK();
                      (local_298->ref_)._q_value.super___atomic_base<int>._M_i =
                           (local_298->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((local_298->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                        QArrayData::deallocate(local_298,2,0x10);
                      }
                    }
                  }
                  QFileInfo::~QFileInfo((QFileInfo *)&local_410);
                  if (uVar35 == 0) goto LAB_0011fd47;
                }
                if ((QArrayData *)local_278._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_278._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_278._0_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_278._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_278._0_8_,2,0x10);
                  }
                }
                QJsonObject::~QJsonObject((QJsonObject *)&local_408);
              }
              else {
                scanImports();
                uVar35 = 1;
              }
              QJsonValue::~QJsonValue((QJsonValue *)&local_58);
              if ((uVar35 & 0xf) != 0) goto LAB_0011ffb8;
              lVar33 = lVar33 + 1;
              lVar28 = QJsonArray::size();
            } while (lVar33 < lVar28);
            uVar35 = 0xe;
LAB_0011ffb8:
            bVar18 = uVar35 == 0xe;
          }
          QJsonArray::~QJsonArray((QJsonArray *)&local_400);
        }
        else {
          scanImports();
          bVar18 = false;
        }
        QJsonDocument::~QJsonDocument((QJsonDocument *)local_3f8);
        if ((QJsonParseError)local_3e8.d.d != (QJsonParseError)0x0) {
          LOCK();
          *(int *)local_3e8.d.d = *(int *)local_3e8.d.d + -1;
          UNLOCK();
          if (*(int *)local_3e8.d.d == 0) {
            QArrayData::deallocate(&(local_3e8.d.d)->super_QArrayData,1,0x10);
          }
        }
      }
      if ((FILE *)local_3f8._8_8_ != (FILE *)0x0) {
        pclose((FILE *)local_3f8._8_8_);
      }
      goto LAB_00120038;
    }
    scanImports();
  }
  bVar18 = true;
LAB_00120038:
  piVar10 = (int *)CONCAT44(local_3b8.d.d._4_4_,local_3b8.d.d._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_3b8.d.d._4_4_,local_3b8.d.d._0_4_),2,0x10)
      ;
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_398);
  if (&(local_358.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_358.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_358.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_358.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_358.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar18;
}

Assistant:

bool scanImports(Options *options, QSet<QString> *usedDependencies)
{
    if (options->verbose)
        fprintf(stdout, "Scanning for QML imports.\n");

    QString qmlImportScanner;
    if (!options->qmlImportScannerBinaryPath.isEmpty()) {
        qmlImportScanner = options->qmlImportScannerBinaryPath;
    } else {
        qmlImportScanner = execSuffixAppended(options->qtLibExecsDirectory +
                                              "/qmlimportscanner"_L1);
    }

    QStringList importPaths;

    // In Conan's case, qtInstallDirectory will point only to qtbase installed files, which
    // lacks a qml directory. We don't want to pass it as an import path if it doesn't exist
    // because it will cause qmlimportscanner to fail.
    // This also covers the case when only qtbase is installed in a regular Qt build.
    const QString mainImportPath = options->qtInstallDirectory + u'/' + options->qtQmlDirectory;
    if (QFile::exists(mainImportPath))
        importPaths += shellQuote(mainImportPath);

    // These are usually provided by CMake in the deployment json file from paths specified
    // in CMAKE_FIND_ROOT_PATH. They might not have qml modules.
    for (const QString &prefix : options->extraPrefixDirs)
        if (QFile::exists(prefix + "/qml"_L1))
            importPaths += shellQuote(prefix + "/qml"_L1);

    // These are provided by both CMake and qmake.
    for (const QString &qmlImportPath : std::as_const(options->qmlImportPaths)) {
        if (QFile::exists(qmlImportPath)) {
            importPaths += shellQuote(qmlImportPath);
        } else {
            fprintf(stderr, "Warning: QML import path %s does not exist.\n",
                    qPrintable(qmlImportPath));
        }
    }

    bool qmlImportExists = false;

    for (const QString &import : importPaths) {
        if (QDir().exists(import)) {
            qmlImportExists = true;
            break;
        }
    }

    // Check importPaths without rootPath, since we need at least one qml plugins
    // folder to run a QML file
    if (!qmlImportExists) {
        fprintf(stderr, "Warning: no 'qml' directory found under Qt install directory "
                "or import paths. Skipping QML dependency scanning.\n");
        return true;
    }

    if (!QFile::exists(qmlImportScanner)) {
        fprintf(stderr, "%s: qmlimportscanner not found at %s\n",
                qmlImportExists ? "Error"_L1.data() : "Warning"_L1.data(),
                qPrintable(qmlImportScanner));
        return true;
    }

    for (auto rootPath : options->rootPaths) {
        rootPath = QFileInfo(rootPath).absoluteFilePath();

        if (!rootPath.endsWith(u'/'))
            rootPath += u'/';

        // After checking for qml folder imports we can add rootPath
        if (!rootPath.isEmpty())
            importPaths += shellQuote(rootPath);

        qmlImportScanner += " -rootPath %1"_L1.arg(shellQuote(rootPath));
    }

    if (!options->qrcFiles.isEmpty()) {
        qmlImportScanner += " -qrcFiles"_L1;
        for (const QString &qrcFile : options->qrcFiles)
            qmlImportScanner += u' ' + shellQuote(qrcFile);
    }

    qmlImportScanner += " -importPath %1"_L1.arg(importPaths.join(u' '));

    if (options->verbose) {
        fprintf(stdout, "Running qmlimportscanner with the following command: %s\n",
            qmlImportScanner.toLocal8Bit().constData());
    }

    auto qmlImportScannerCommand = openProcess(qmlImportScanner);
    if (qmlImportScannerCommand == 0) {
        fprintf(stderr, "Couldn't run qmlimportscanner.\n");
        return false;
    }

    QByteArray output;
    char buffer[512];
    while (fgets(buffer, sizeof(buffer), qmlImportScannerCommand.get()) != nullptr)
        output += QByteArray(buffer, qstrlen(buffer));

    QJsonDocument jsonDocument = QJsonDocument::fromJson(output);
    if (jsonDocument.isNull()) {
        fprintf(stderr, "Invalid json output from qmlimportscanner.\n");
        return false;
    }

    QJsonArray jsonArray = jsonDocument.array();
    for (int i=0; i<jsonArray.count(); ++i) {
        QJsonValue value = jsonArray.at(i);
        if (!value.isObject()) {
            fprintf(stderr, "Invalid format of qmlimportscanner output.\n");
            return false;
        }

        QJsonObject object = value.toObject();
        QString path = object.value("path"_L1).toString();
        if (path.isEmpty()) {
            fprintf(stderr, "Warning: QML import could not be resolved in any of the import paths: %s\n",
                    qPrintable(object.value("name"_L1).toString()));
        } else if (object.value("type"_L1).toString() == "module"_L1) {
            if (options->verbose)
                fprintf(stdout, "  -- Adding '%s' as QML dependency\n", qPrintable(path));

            QFileInfo info(path);

            // The qmlimportscanner sometimes outputs paths that do not exist.
            if (!info.exists()) {
                if (options->verbose)
                    fprintf(stdout, "    -- Skipping because path does not exist.\n");
                continue;
            }

            QString absolutePath = info.absolutePath();
            if (!absolutePath.endsWith(u'/'))
                absolutePath += u'/';

            const QUrl url(object.value("name"_L1).toString());

            const QString moduleUrlPath = u"/"_s + url.toString().replace(u'.', u'/');
            if (checkCanImportFromRootPaths(options, info.absolutePath(), moduleUrlPath)) {
                if (options->verbose)
                    fprintf(stdout, "    -- Skipping because path is in QML root path.\n");
                continue;
            }

            QString importPathOfThisImport;
            for (const QString &importPath : std::as_const(importPaths)) {
                QString cleanImportPath = QDir::cleanPath(importPath);
                if (QFile::exists(cleanImportPath + moduleUrlPath)) {
                    importPathOfThisImport = importPath;
                    break;
                }
            }

            if (importPathOfThisImport.isEmpty()) {
                fprintf(stderr, "Import found outside of import paths: %s.\n", qPrintable(info.absoluteFilePath()));
                return false;
            }

            importPathOfThisImport = QDir(importPathOfThisImport).absolutePath() + u'/';
            QList<QtDependency> qmlImportsDependencies;
            auto collectQmlDependency = [&usedDependencies, &qmlImportsDependencies,
                                         &importPathOfThisImport](const QString &filePath) {
                if (!usedDependencies->contains(filePath)) {
                    usedDependencies->insert(filePath);
                    qmlImportsDependencies += QtDependency(
                            "qml/"_L1 + filePath.mid(importPathOfThisImport.size()),
                            filePath);
                }
            };

            QString plugin = object.value("plugin"_L1).toString();
            bool pluginIsOptional = object.value("pluginIsOptional"_L1).toBool();
            QFileInfo pluginFileInfo = QFileInfo(
                    path + u'/' + "lib"_L1 + plugin + u'_'
                    + options->currentArchitecture + ".so"_L1);
            QString pluginFilePath = pluginFileInfo.absoluteFilePath();
            QSet<QString> remainingDependencies;
            if (pluginFileInfo.exists() && checkArchitecture(*options, pluginFilePath)
                && readDependenciesFromElf(options, pluginFilePath, usedDependencies,
                                           &remainingDependencies)) {
                collectQmlDependency(pluginFilePath);
            } else if (!pluginIsOptional) {
                if (options->verbose)
                    fprintf(stdout, "    -- Skipping because the required plugin is missing.\n");
                continue;
            }

            QFileInfo qmldirFileInfo = QFileInfo(path + u'/' + "qmldir"_L1);
            if (qmldirFileInfo.exists()) {
                collectQmlDependency(qmldirFileInfo.absoluteFilePath());
            }

            QString prefer = object.value("prefer"_L1).toString();
            // If the preferred location of Qml files points to the Qt resources, this means
            // that all Qml files has been embedded into plugin and we should not copy them to the
            // android rcc bundle
            if (!prefer.startsWith(":/"_L1)) {
                QVariantList qmlFiles =
                        object.value("components"_L1).toArray().toVariantList();
                qmlFiles.append(object.value("scripts"_L1).toArray().toVariantList());
                bool qmlFilesMissing = false;
                for (const auto &qmlFileEntry : qmlFiles) {
                    QFileInfo fileInfo(qmlFileEntry.toString());
                    if (!fileInfo.exists()) {
                        qmlFilesMissing = true;
                        break;
                    }
                    collectQmlDependency(fileInfo.absoluteFilePath());
                }

                if (qmlFilesMissing) {
                    if (options->verbose)
                        fprintf(stdout,
                                "    -- Skipping because the required qml files are missing.\n");
                    continue;
                }
            }

            options->qtDependencies[options->currentArchitecture].append(qmlImportsDependencies);
        } else {
            // We don't need to handle file and directory imports. Generally those should be
            // considered as part of the application and are therefore scanned separately.
        }
    }

    return true;
}